

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O0

void __thiscall
Corrade::Containers::
Optional<Corrade::Containers::Array<const_char,_Corrade::Utility::Path::MapDeleter>_>::Optional
          (Optional<Corrade::Containers::Array<const_char,_Corrade::Utility::Path::MapDeleter>_>
           *this,Array<const_char,_Corrade::Utility::Path::MapDeleter> *value)

{
  type *other;
  Array<const_char,_Corrade::Utility::Path::MapDeleter> *value_local;
  Optional<Corrade::Containers::Array<const_char,_Corrade::Utility::Path::MapDeleter>_> *this_local;
  
  this->_set = true;
  other = Utility::move<Corrade::Containers::Array<char_const,Corrade::Utility::Path::MapDeleter>&>
                    (value);
  Array<const_char,_Corrade::Utility::Path::MapDeleter>::Array
            ((Array<const_char,_Corrade::Utility::Path::MapDeleter> *)this,other);
  return;
}

Assistant:

Optional(T&& value) noexcept(std::is_nothrow_move_constructible<T>::value): _set{true} {
            /* Can't use {}, see the GCC 4.8-specific overload for details */
            #if defined(CORRADE_TARGET_GCC) && !defined(CORRADE_TARGET_CLANG) && __GNUC__ < 5
            Implementation::construct(_value, Utility::move(value));
            #else
            new(&_value) T{Utility::move(value)};
            #endif
        }